

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlClosure.h
# Opt level: O0

set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> * __thiscall
dg::StrongControlClosure::theta
          (StrongControlClosure *this,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *X,CDNode *n)

{
  size_type sVar1;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *in_RSI;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *in_RDI;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *retval;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *in_stack_00000068;
  StrongControlClosure *in_stack_00000070;
  value_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::set
            ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)0x2544e9);
  sVar1 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::count
                    (in_RSI,(key_type *)in_RDI);
  if (sVar1 == 0) {
    foreachFirstReachable<std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>,dg::StrongControlClosure::theta(std::set<dg::CDNode*,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>const&,dg::CDNode*)::_lambda(dg::CDNode*)_1_>
              (in_stack_00000070,in_stack_00000068,(CDNode *)retval,(anon_class_8_1_6972301e *)this)
    ;
  }
  else {
    std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
              ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

std::set<CDNode *> theta(const std::set<CDNode *> &X, CDNode *n) {
        std::set<CDNode *> retval;
        if (X.count(n) > 0) {
            retval.insert(n);
            return retval;
        }
        foreachFirstReachable(X, n, [&](CDNode *cur) { retval.insert(cur); });
        return retval;
    }